

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall chrono::ChLinkUniversal::ChLinkUniversal(ChLinkUniversal *this)

{
  ChVector<double> local_48;
  ChQuaternion<double> local_30;
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkUniversal_01169880;
  local_30.m_data[0] = 1.0;
  local_48.m_data[2] = 0.0;
  local_30.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_30.m_data[1] = 0.0;
  local_30.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_frame1,&local_48,&local_30);
  local_48.m_data[2] = 0.0;
  local_30.m_data[0] = 1.0;
  local_30.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_30.m_data[1] = 0.0;
  local_30.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_frame2,&local_48,&local_30);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_x);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_y);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_z);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  this->m_multipliers[0] = 0.0;
  this->m_multipliers[1] = 0.0;
  this->m_multipliers[2] = 0.0;
  this->m_multipliers[3] = 0.0;
  return;
}

Assistant:

ChLinkUniversal::ChLinkUniversal() {
    m_multipliers[0] = 0;
    m_multipliers[1] = 0;
    m_multipliers[2] = 0;
    m_multipliers[3] = 0;
}